

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O3

bool __thiscall Rml::DataParser::Parse(DataParser *this,bool is_assignment_expression)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pIVar3;
  pointer pIVar4;
  pointer pvVar5;
  pointer pvVar6;
  bool *out_valid_function_name;
  pointer pcVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  pointer pIVar13;
  pointer this_00;
  byte bVar14;
  String variable_name;
  size_type __dnew_1;
  size_type __dnew;
  String local_70;
  String local_50;
  size_type local_30;
  
  pIVar3 = (this->program).
           super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar4 = (this->program).
           super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pIVar13 = pIVar3;
  if (pIVar4 != pIVar3) {
    do {
      Variant::~Variant(&pIVar13->data);
      pIVar13 = pIVar13 + 1;
    } while (pIVar13 != pIVar4);
    (this->program).super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
    _M_impl.super__Vector_impl_data._M_finish = pIVar3;
  }
  pvVar5 = (this->variable_addresses).
           super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (this->variable_addresses).
           super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pvVar5;
  if (pvVar6 != pvVar5) {
    do {
      ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector(this_00)
      ;
      this_00 = this_00 + 1;
    } while (this_00 != pvVar6);
    (this->variable_addresses).
    super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar5;
  }
  this->index = 0;
  this->reached_end = false;
  this->parse_error = false;
  uVar12 = (this->expression)._M_string_length;
  bVar14 = uVar12 == 0;
  if ((bool)bVar14) {
    this->reached_end = true;
    pbVar9 = (byte *)(this->expression)._M_dataplus._M_p;
    uVar11 = 0;
  }
  else {
    pbVar9 = (byte *)(this->expression)._M_dataplus._M_p;
    uVar11 = (ulong)*pbVar9;
  }
  uVar10 = 0;
LAB_001f37ab:
  do {
    uVar10 = uVar10 + 1;
    if ((0x20 < (byte)uVar11) || ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0)) goto LAB_001f37dd;
    this->index = uVar10;
    if (uVar10 < uVar12) {
      if ((bool)bVar14 == false) {
        uVar11 = (ulong)pbVar9[uVar10];
        goto LAB_001f37ab;
      }
    }
    else {
      this->reached_end = true;
      bVar14 = true;
    }
    uVar11 = 0;
  } while( true );
LAB_001f386f:
  if ((bVar14 & 1) == 0) {
    bVar14 = pcVar7[uVar10];
    if (bVar14 < 0x3b) {
      if ((bVar14 != 0) && (bVar14 != 0x28)) {
LAB_001f3ae3:
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"one of  = ; (  or end of string","");
        Expected(this,&local_50);
LAB_001f3ac3:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001f3985;
      }
    }
    else if (bVar14 != 0x3b) {
      if (bVar14 != 0x3d) goto LAB_001f3ae3;
      Match(this,'=',true);
      Rml::Parse::Expression(this);
      VariableGetSet(this,&local_70,true);
      goto LAB_001f3886;
    }
  }
  Rml::Parse::Function(this,EventFnc,&local_70,false);
LAB_001f3886:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,(ulong)(local_70.field_2._M_allocated_capacity + 1));
  }
  bVar14 = this->reached_end;
LAB_001f38a0:
  if ((bVar14 & 1) != 0) goto LAB_001f399c;
  cVar2 = (this->expression)._M_dataplus._M_p[this->index];
  if (cVar2 != ';') goto LAB_001f3931;
  Match(this,';',true);
  bVar14 = this->reached_end;
  goto LAB_001f37f0;
LAB_001f3931:
  if (cVar2 != '\0') {
    local_50._M_dataplus._M_p = (pointer)0x14;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    local_70._M_dataplus._M_p =
         (pointer)::std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_50);
    local_70.field_2._M_allocated_capacity = (size_type)local_50._M_dataplus._M_p;
    builtin_strncpy(local_70._M_dataplus._M_p,"\';\' or end of string",0x14);
    local_70._M_string_length = (size_type)local_50._M_dataplus._M_p;
    local_70._M_dataplus._M_p[(long)local_50._M_dataplus._M_p] = '\0';
    Expected(this,&local_70);
LAB_001f3985:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,(ulong)(local_70.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  goto LAB_001f399c;
LAB_001f37dd:
  if (is_assignment_expression) {
    paVar1 = &local_70.field_2;
LAB_001f37f0:
    if (((bVar14 & 1) == 0) &&
       (out_valid_function_name = (bool *)(this->expression)._M_dataplus._M_p,
       out_valid_function_name[this->index] != false)) {
      Rml::Parse::VariableOrFunctionName_abi_cxx11_
                (&local_70,(Parse *)this,(DataParser *)0x0,out_valid_function_name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar14 = this->reached_end;
        pcVar7 = (this->expression)._M_dataplus._M_p;
        if ((bool)bVar14 == false) {
          uVar12 = (ulong)(byte)pcVar7[this->index];
        }
        else {
          uVar12 = 0;
        }
        uVar11 = (this->expression)._M_string_length;
        uVar10 = this->index;
LAB_001f383c:
        do {
          uVar8 = uVar10 + 1;
          if ((0x20 < (byte)uVar12) || ((0x100002600U >> (uVar12 & 0x3f) & 1) == 0))
          goto LAB_001f386f;
          this->index = uVar8;
          uVar10 = uVar8;
          if (uVar8 < uVar11) {
            if ((bVar14 & 1) == 0) {
              uVar12 = (ulong)(byte)pcVar7[uVar8];
              goto LAB_001f383c;
            }
          }
          else {
            this->reached_end = true;
            bVar14 = 1;
          }
          uVar12 = 0;
        } while( true );
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_30 = 0x39;
      local_50._M_dataplus._M_p =
           (pointer)::std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_30);
      local_50.field_2._M_allocated_capacity = local_30;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x29) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x2a) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x2b) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x2c) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x2d) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x2e) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x2f) = 'm';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x30) = 'p';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x31) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x32) = 'y';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x33) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x34) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x35) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x36) = 'm';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x37) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x38) = '.';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x20) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x21) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x22) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x23) = 'b';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x24) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x25) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x26) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x27) = 'g';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x28) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x29) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x2a) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x2b) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x2c) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x2d) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x2e) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x2f) = 'm';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x10) = 'b';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x11) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x12) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x13) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x14) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x15) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x16) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x17) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x18) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x19) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x1a) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x1b) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x1c) = 'g';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x1d) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x1e) = 'm';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0x1f) = 'e';
      *(undefined8 *)local_50._M_dataplus._M_p = 0x6465746365707845;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 8) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 9) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 10) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0xb) = 'v';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0xc) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0xd) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0xe) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p + 0xf) = 'a';
      local_50._M_string_length = local_30;
      local_50._M_dataplus._M_p[local_30] = '\0';
      Error(this,&local_50);
      goto LAB_001f3ac3;
    }
    goto LAB_001f38a0;
  }
  Rml::Parse::Expression(this);
LAB_001f399c:
  if (this->reached_end == false) {
    this->parse_error = true;
    CreateString_abi_cxx11_
              (&local_70,"Unexpected character \'%c\' encountered.",
               (ulong)(uint)(int)(this->expression)._M_dataplus._M_p[this->index]);
    Error(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,(ulong)(local_70.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  if (this->parse_error == false) {
    if (this->program_stack_size == 0) {
      bVar14 = 1;
    }
    else {
      this->parse_error = true;
      CreateString_abi_cxx11_
                (&local_70,
                 "Internal parser error, inconsistent stack operations. Stack size is %d at parse end."
                );
      Error(this,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        (ulong)(local_70.field_2._M_allocated_capacity + 1));
      }
      bVar14 = this->parse_error ^ 1;
    }
  }
  else {
    bVar14 = 0;
  }
  return (bool)(bVar14 & 1);
}

Assistant:

bool Parse(bool is_assignment_expression)
	{
		program.clear();
		variable_addresses.clear();
		index = 0;
		reached_end = false;
		parse_error = false;
		if (expression.empty())
			reached_end = true;

		SkipWhitespace();

		if (is_assignment_expression)
			Parse::Assignment(*this);
		else
			Parse::Expression(*this);

		if (!reached_end)
		{
			parse_error = true;
			Error(CreateString("Unexpected character '%c' encountered.", Look()));
		}
		if (!parse_error && program_stack_size != 0)
		{
			parse_error = true;
			Error(CreateString("Internal parser error, inconsistent stack operations. Stack size is %d at parse end.", program_stack_size));
		}

		return !parse_error;
	}